

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::LetDeclSymbol::LetDeclSymbol
          (LetDeclSymbol *this,Compilation *compilation,ExpressionSyntax *exprSyntax,
          string_view name,SourceLocation loc)

{
  string_view name_00;
  Scope *in_RCX;
  Symbol *in_RDI;
  char *in_R8;
  SourceLocation in_R9;
  Symbol *in_stack_ffffffffffffffb0;
  
  name_00._M_str = in_R8;
  name_00._M_len = (size_t)in_RCX;
  Symbol::Symbol(in_RDI,LetDecl,name_00,in_R9);
  Scope::Scope(in_RCX,(Compilation *)in_R9,in_stack_ffffffffffffffb0);
  std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)0x912f04)
  ;
  not_null<const_slang::syntax::ExpressionSyntax_*>::
  not_null<const_slang::syntax::ExpressionSyntax_*>
            ((not_null<const_slang::syntax::ExpressionSyntax_*> *)&in_RDI[2].name,
             (ExpressionSyntax **)&stack0xffffffffffffffb0);
  return;
}

Assistant:

LetDeclSymbol::LetDeclSymbol(Compilation& compilation, const ExpressionSyntax& exprSyntax,
                             std::string_view name, SourceLocation loc) :
    Symbol(SymbolKind::LetDecl, name, loc), Scope(compilation, this), exprSyntax(&exprSyntax) {
}